

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void aom_highbd_comp_mask_pred_sse2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  longlong lVar1;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i s1_00;
  __m128i s1_01;
  __m128i s1_02;
  __m128i s1_03;
  __m128i s1_04;
  __m128i s0_00;
  __m128i s0_01;
  __m128i s0_02;
  __m128i s0_03;
  __m128i s0_04;
  longlong *plVar2;
  undefined8 *puVar3;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  long in_stack_00000008;
  int in_stack_00000010;
  __m128i comp1_1;
  __m128i comp_2;
  __m128i m23_16_1;
  __m128i m01_16_1;
  __m128i m_8_2;
  __m128i s3_1;
  __m128i s1_2;
  __m128i s2_1;
  __m128i s0_2;
  int j;
  int x;
  __m128i comp1;
  __m128i comp_1;
  __m128i m23_16;
  __m128i m01_16;
  __m128i m_8_1;
  __m128i s3;
  __m128i s1_1;
  __m128i s2;
  __m128i s0_1;
  __m128i comp;
  __m128i m_16;
  __m128i m_8;
  __m128i s1;
  __m128i s0;
  __m128i zero;
  int stride1;
  int stride0;
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *ref;
  uint16_t *pred;
  uint16_t *comp_pred;
  int i;
  undefined8 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc59;
  undefined1 in_stack_fffffffffffffc5a;
  undefined1 in_stack_fffffffffffffc5b;
  undefined1 in_stack_fffffffffffffc5c;
  undefined1 in_stack_fffffffffffffc5d;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  undefined1 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc61;
  undefined1 in_stack_fffffffffffffc62;
  undefined1 in_stack_fffffffffffffc63;
  undefined1 in_stack_fffffffffffffc64;
  undefined1 in_stack_fffffffffffffc65;
  undefined1 in_stack_fffffffffffffc66;
  undefined1 in_stack_fffffffffffffc67;
  undefined1 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc69;
  undefined1 in_stack_fffffffffffffc6a;
  undefined1 in_stack_fffffffffffffc6b;
  undefined1 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6d;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  undefined1 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc71;
  undefined1 in_stack_fffffffffffffc72;
  undefined1 in_stack_fffffffffffffc73;
  undefined1 in_stack_fffffffffffffc74;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  longlong in_stack_fffffffffffffc78;
  longlong lVar4;
  int local_330;
  int local_32c;
  undefined8 *local_208;
  int local_200;
  undefined1 local_148;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  byte bStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  byte bStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  
  local_200 = 0;
  local_208 = (undefined8 *)(in_RDI << 1);
  if (in_EDX == 8) {
    do {
      s0_00[0]._1_1_ = in_stack_fffffffffffffc71;
      s0_00[0]._0_1_ = in_stack_fffffffffffffc70;
      s0_00[0]._2_1_ = in_stack_fffffffffffffc72;
      s0_00[0]._3_1_ = in_stack_fffffffffffffc73;
      s0_00[0]._4_1_ = in_stack_fffffffffffffc74;
      s0_00[0]._5_1_ = in_stack_fffffffffffffc75;
      s0_00[0]._6_1_ = in_stack_fffffffffffffc76;
      s0_00[0]._7_1_ = in_stack_fffffffffffffc77;
      s0_00[1] = in_stack_fffffffffffffc78;
      s1_00[0]._1_1_ = in_stack_fffffffffffffc61;
      s1_00[0]._0_1_ = in_stack_fffffffffffffc60;
      s1_00[0]._2_1_ = in_stack_fffffffffffffc62;
      s1_00[0]._3_1_ = in_stack_fffffffffffffc63;
      s1_00[0]._4_1_ = in_stack_fffffffffffffc64;
      s1_00[0]._5_1_ = in_stack_fffffffffffffc65;
      s1_00[0]._6_1_ = in_stack_fffffffffffffc66;
      s1_00[0]._7_1_ = in_stack_fffffffffffffc67;
      s1_00[1]._0_1_ = in_stack_fffffffffffffc68;
      s1_00[1]._1_1_ = in_stack_fffffffffffffc69;
      s1_00[1]._2_1_ = in_stack_fffffffffffffc6a;
      s1_00[1]._3_1_ = in_stack_fffffffffffffc6b;
      s1_00[1]._4_1_ = in_stack_fffffffffffffc6c;
      s1_00[1]._5_1_ = in_stack_fffffffffffffc6d;
      s1_00[1]._6_1_ = in_stack_fffffffffffffc6e;
      s1_00[1]._7_1_ = in_stack_fffffffffffffc6f;
      a[1]._0_1_ = in_stack_fffffffffffffc58;
      a[0] = in_stack_fffffffffffffc50;
      a[1]._1_1_ = in_stack_fffffffffffffc59;
      a[1]._2_1_ = in_stack_fffffffffffffc5a;
      a[1]._3_1_ = in_stack_fffffffffffffc5b;
      a[1]._4_1_ = in_stack_fffffffffffffc5c;
      a[1]._5_1_ = in_stack_fffffffffffffc5d;
      a[1]._6_1_ = in_stack_fffffffffffffc5e;
      a[1]._7_1_ = in_stack_fffffffffffffc5f;
      highbd_comp_mask_pred_line_sse2(s0_00,s1_00,a);
      *local_208 = extraout_XMM0_Qa;
      local_208[1] = extraout_XMM0_Qb;
      local_208 = local_208 + 2;
      local_200 = local_200 + 1;
    } while (local_200 < in_ECX);
  }
  else if (in_EDX == 0x10) {
    do {
      s0_01[0]._1_1_ = in_stack_fffffffffffffc71;
      s0_01[0]._0_1_ = in_stack_fffffffffffffc70;
      s0_01[0]._2_1_ = in_stack_fffffffffffffc72;
      s0_01[0]._3_1_ = in_stack_fffffffffffffc73;
      s0_01[0]._4_1_ = in_stack_fffffffffffffc74;
      s0_01[0]._5_1_ = in_stack_fffffffffffffc75;
      s0_01[0]._6_1_ = in_stack_fffffffffffffc76;
      s0_01[0]._7_1_ = in_stack_fffffffffffffc77;
      s0_01[1] = in_stack_fffffffffffffc78;
      s1_01[0]._1_1_ = in_stack_fffffffffffffc61;
      s1_01[0]._0_1_ = in_stack_fffffffffffffc60;
      s1_01[0]._2_1_ = in_stack_fffffffffffffc62;
      s1_01[0]._3_1_ = in_stack_fffffffffffffc63;
      s1_01[0]._4_1_ = in_stack_fffffffffffffc64;
      s1_01[0]._5_1_ = in_stack_fffffffffffffc65;
      s1_01[0]._6_1_ = in_stack_fffffffffffffc66;
      s1_01[0]._7_1_ = in_stack_fffffffffffffc67;
      s1_01[1]._0_1_ = in_stack_fffffffffffffc68;
      s1_01[1]._1_1_ = in_stack_fffffffffffffc69;
      s1_01[1]._2_1_ = in_stack_fffffffffffffc6a;
      s1_01[1]._3_1_ = in_stack_fffffffffffffc6b;
      s1_01[1]._4_1_ = in_stack_fffffffffffffc6c;
      s1_01[1]._5_1_ = in_stack_fffffffffffffc6d;
      s1_01[1]._6_1_ = in_stack_fffffffffffffc6e;
      s1_01[1]._7_1_ = in_stack_fffffffffffffc6f;
      a_00[1]._0_1_ = in_stack_fffffffffffffc58;
      a_00[0] = in_stack_fffffffffffffc50;
      a_00[1]._1_1_ = in_stack_fffffffffffffc59;
      a_00[1]._2_1_ = in_stack_fffffffffffffc5a;
      a_00[1]._3_1_ = in_stack_fffffffffffffc5b;
      a_00[1]._4_1_ = in_stack_fffffffffffffc5c;
      a_00[1]._5_1_ = in_stack_fffffffffffffc5d;
      a_00[1]._6_1_ = in_stack_fffffffffffffc5e;
      a_00[1]._7_1_ = in_stack_fffffffffffffc5f;
      highbd_comp_mask_pred_line_sse2(s0_01,s1_01,a_00);
      s0_02[0]._1_1_ = in_stack_fffffffffffffc71;
      s0_02[0]._0_1_ = in_stack_fffffffffffffc70;
      s0_02[0]._2_1_ = in_stack_fffffffffffffc72;
      s0_02[0]._3_1_ = in_stack_fffffffffffffc73;
      s0_02[0]._4_1_ = in_stack_fffffffffffffc74;
      s0_02[0]._5_1_ = in_stack_fffffffffffffc75;
      s0_02[0]._6_1_ = in_stack_fffffffffffffc76;
      s0_02[0]._7_1_ = in_stack_fffffffffffffc77;
      s0_02[1] = in_stack_fffffffffffffc78;
      s1_02[0]._1_1_ = in_stack_fffffffffffffc61;
      s1_02[0]._0_1_ = in_stack_fffffffffffffc60;
      s1_02[0]._2_1_ = in_stack_fffffffffffffc62;
      s1_02[0]._3_1_ = in_stack_fffffffffffffc63;
      s1_02[0]._4_1_ = in_stack_fffffffffffffc64;
      s1_02[0]._5_1_ = in_stack_fffffffffffffc65;
      s1_02[0]._6_1_ = in_stack_fffffffffffffc66;
      s1_02[0]._7_1_ = in_stack_fffffffffffffc67;
      s1_02[1]._0_1_ = in_stack_fffffffffffffc68;
      s1_02[1]._1_1_ = in_stack_fffffffffffffc69;
      s1_02[1]._2_1_ = in_stack_fffffffffffffc6a;
      s1_02[1]._3_1_ = in_stack_fffffffffffffc6b;
      s1_02[1]._4_1_ = in_stack_fffffffffffffc6c;
      s1_02[1]._5_1_ = in_stack_fffffffffffffc6d;
      s1_02[1]._6_1_ = in_stack_fffffffffffffc6e;
      s1_02[1]._7_1_ = in_stack_fffffffffffffc6f;
      a_01[1]._0_1_ = in_stack_fffffffffffffc58;
      a_01[0] = in_stack_fffffffffffffc50;
      a_01[1]._1_1_ = in_stack_fffffffffffffc59;
      a_01[1]._2_1_ = in_stack_fffffffffffffc5a;
      a_01[1]._3_1_ = in_stack_fffffffffffffc5b;
      a_01[1]._4_1_ = in_stack_fffffffffffffc5c;
      a_01[1]._5_1_ = in_stack_fffffffffffffc5d;
      a_01[1]._6_1_ = in_stack_fffffffffffffc5e;
      a_01[1]._7_1_ = in_stack_fffffffffffffc5f;
      highbd_comp_mask_pred_line_sse2(s0_02,s1_02,a_01);
      *local_208 = extraout_XMM0_Qa_00;
      local_208[1] = extraout_XMM0_Qb_00;
      local_208[2] = extraout_XMM0_Qa_01;
      local_208[3] = extraout_XMM0_Qb_01;
      local_208 = local_208 + 4;
      local_200 = local_200 + 1;
    } while (local_200 < in_ECX);
  }
  else {
    do {
      for (local_32c = 0; local_32c < in_EDX; local_32c = local_32c + 0x20) {
        for (local_330 = 0; local_330 < 2; local_330 = local_330 + 1) {
          plVar2 = (longlong *)(in_stack_00000008 + local_32c + (long)(local_330 << 4));
          lVar4 = *plVar2;
          lVar1 = plVar2[1];
          local_138 = (undefined1)lVar4;
          uStack_137 = (undefined1)((ulong)lVar4 >> 8);
          uStack_136 = (undefined1)((ulong)lVar4 >> 0x10);
          uStack_135 = (undefined1)((ulong)lVar4 >> 0x18);
          bStack_134 = (byte)((ulong)lVar4 >> 0x20);
          uStack_133 = (undefined1)((ulong)lVar4 >> 0x28);
          uStack_132 = (undefined1)((ulong)lVar4 >> 0x30);
          uStack_131 = (undefined1)((ulong)lVar4 >> 0x38);
          local_148 = 0;
          uStack_147 = 0;
          uStack_146 = 0;
          uStack_145 = 0;
          uStack_144 = 0;
          uStack_143 = 0;
          uStack_142 = 0;
          uStack_141 = 0;
          uStack_30 = (undefined1)lVar1;
          uStack_2f = (undefined1)((ulong)lVar1 >> 8);
          uStack_2e = (undefined1)((ulong)lVar1 >> 0x10);
          uStack_2d = (undefined1)((ulong)lVar1 >> 0x18);
          bStack_2c = (byte)((ulong)lVar1 >> 0x20);
          uStack_2b = (undefined1)((ulong)lVar1 >> 0x28);
          uStack_2a = (undefined1)((ulong)lVar1 >> 0x30);
          uStack_29 = (undefined1)((ulong)lVar1 >> 0x38);
          uStack_40 = 0;
          uStack_3f = 0;
          uStack_3e = 0;
          uStack_3d = 0;
          uStack_3c = 0;
          uStack_3b = 0;
          uStack_3a = 0;
          uStack_39 = 0;
          s0_03[1] = lVar4;
          s0_03[0] = (ulong)CONCAT16(uStack_131,
                                     (uint6)CONCAT14(uStack_132,
                                                     (uint)CONCAT12(uStack_133,(ushort)bStack_134)))
          ;
          s1_03[1]._0_1_ = local_138;
          s1_03[0] = (ulong)CONCAT16(uStack_29,
                                     (uint6)CONCAT14(uStack_2a,
                                                     (uint)CONCAT12(uStack_2b,(ushort)bStack_2c)));
          s1_03[1]._1_1_ = 0;
          s1_03[1]._2_1_ = uStack_137;
          s1_03[1]._3_1_ = 0;
          s1_03[1]._4_1_ = uStack_136;
          s1_03[1]._5_1_ = 0;
          s1_03[1]._6_1_ = uStack_135;
          s1_03[1]._7_1_ = 0;
          a_02[1]._0_1_ = uStack_30;
          a_02[0] = in_stack_fffffffffffffc50;
          a_02[1]._1_1_ = 0;
          a_02[1]._2_1_ = uStack_2f;
          a_02[1]._3_1_ = 0;
          a_02[1]._4_1_ = uStack_2e;
          a_02[1]._5_1_ = 0;
          a_02[1]._6_1_ = uStack_2d;
          a_02[1]._7_1_ = 0;
          highbd_comp_mask_pred_line_sse2(s0_03,s1_03,a_02);
          s0_04[0]._1_1_ = uStack_144;
          s0_04[0]._0_1_ = bStack_134;
          s0_04[0]._2_1_ = uStack_133;
          s0_04[0]._3_1_ = uStack_143;
          s0_04[0]._4_1_ = uStack_132;
          s0_04[0]._5_1_ = uStack_142;
          s0_04[0]._6_1_ = uStack_131;
          s0_04[0]._7_1_ = uStack_141;
          s0_04[1] = lVar4;
          s1_04[0]._1_1_ = uStack_3c;
          s1_04[0]._0_1_ = bStack_2c;
          s1_04[0]._2_1_ = uStack_2b;
          s1_04[0]._3_1_ = uStack_3b;
          s1_04[0]._4_1_ = uStack_2a;
          s1_04[0]._5_1_ = uStack_3a;
          s1_04[0]._6_1_ = uStack_29;
          s1_04[0]._7_1_ = uStack_39;
          s1_04[1]._0_1_ = local_138;
          s1_04[1]._1_1_ = local_148;
          s1_04[1]._2_1_ = uStack_137;
          s1_04[1]._3_1_ = uStack_147;
          s1_04[1]._4_1_ = uStack_136;
          s1_04[1]._5_1_ = uStack_146;
          s1_04[1]._6_1_ = uStack_135;
          s1_04[1]._7_1_ = uStack_145;
          a_03[1]._0_1_ = uStack_30;
          a_03[0] = extraout_XMM0_Qb_02;
          a_03[1]._1_1_ = uStack_40;
          a_03[1]._2_1_ = uStack_2f;
          a_03[1]._3_1_ = uStack_3f;
          a_03[1]._4_1_ = uStack_2e;
          a_03[1]._5_1_ = uStack_3e;
          a_03[1]._6_1_ = uStack_2d;
          a_03[1]._7_1_ = uStack_3d;
          in_stack_fffffffffffffc50 = extraout_XMM0_Qb_02;
          highbd_comp_mask_pred_line_sse2(s0_04,s1_04,a_03);
          puVar3 = (undefined8 *)((long)local_208 + (long)(local_330 << 4) * 2);
          *puVar3 = extraout_XMM0_Qa_02;
          puVar3[1] = in_stack_fffffffffffffc50;
          puVar3 = (undefined8 *)((long)local_208 + (long)(local_330 << 4) * 2 + 0x10);
          *puVar3 = extraout_XMM0_Qa_03;
          puVar3[1] = extraout_XMM0_Qb_03;
        }
        local_208 = local_208 + 8;
      }
      in_stack_00000008 = in_stack_00000008 + in_stack_00000010;
      local_200 = local_200 + 1;
    } while (local_200 < in_ECX);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_sse2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m128i zero = _mm_setzero_si128();

  if (width == 8) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i m_8 = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_16 = _mm_unpacklo_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s2 = _mm_loadu_si128((const __m128i *)(src0 + 8));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i s3 = _mm_loadu_si128((const __m128i *)(src1 + 8));

      const __m128i m_8 = _mm_loadu_si128((const __m128i *)mask);
      const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
      const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
      const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);
      _mm_storeu_si128((__m128i *)(comp_pred + 8), comp1);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        for (int j = 0; j < 2; j++) {
          const __m128i s0 =
              _mm_loadu_si128((const __m128i *)(src0 + x + j * 16));
          const __m128i s2 =
              _mm_loadu_si128((const __m128i *)(src0 + x + 8 + j * 16));
          const __m128i s1 =
              _mm_loadu_si128((const __m128i *)(src1 + x + j * 16));
          const __m128i s3 =
              _mm_loadu_si128((const __m128i *)(src1 + x + 8 + j * 16));

          const __m128i m_8 =
              _mm_loadu_si128((const __m128i *)(mask + x + j * 16));
          const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
          const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

          const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
          const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

          _mm_storeu_si128((__m128i *)(comp_pred + j * 16), comp);
          _mm_storeu_si128((__m128i *)(comp_pred + 8 + j * 16), comp1);
        }
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}